

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O3

LispPTR * N_OP_unbind(LispPTR *stack_pointer)

{
  uint uVar1;
  ulong uVar2;
  
  do {
    uVar1 = stack_pointer[-1];
    stack_pointer = stack_pointer + -1;
  } while (-1 < (int)uVar1);
  if (uVar1 < 0xffff0000) {
    uVar2 = (ulong)((~uVar1 >> 0x10) - 1);
    memset(MachineState.pvar + uVar2 * -2 + (ulong)(uVar1 & 0xffff),0xff,uVar2 * 4 + 4);
  }
  return stack_pointer;
}

Assistant:

LispPTR *N_OP_unbind(LispPTR *stack_pointer) {
  DLword num;     /* number of unbind sot */
  LispPTR *ppvar; /* pointer to last PVAR slot. */
  DLword i;       /* temporary for control */
  LispPTR value;

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_unbind()\n");
#endif

  /* now, stack_pointer points the latter part in slot */
  for (; !(*--stack_pointer & 0x80000000);)
    ; /* scan (until MSB == 1) */

  value = *stack_pointer;
  num = (DLword) ~(value >> 16);
  ppvar = (LispPTR *)(PVar + 2 + GetLoWord(value));
  value = 0xffffffff;
  for (i = 0; i < num; i++) { *--ppvar = value; }
  return (stack_pointer);
}